

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O2

size_t duckdb_zstd::FSE_writeNCount
                 (void *buffer,size_t bufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog)

{
  size_t sVar1;
  ulong uVar2;
  undefined8 uStack_8;
  
  if (tableLog < 0xd) {
    if (4 < tableLog) {
      uVar2 = 0x200;
      if (maxSymbolValue != 0) {
        uVar2 = (ulong)(((maxSymbolValue + 1) * tableLog + 6 >> 3) + 3);
      }
      sVar1 = FSE_writeNCount_generic
                        (buffer,bufferSize,normalizedCounter,maxSymbolValue,tableLog,
                         (uint)(uVar2 <= bufferSize));
      return sVar1;
    }
    uStack_8 = 0xffffffffffffffff;
  }
  else {
    uStack_8 = 0xffffffffffffffd4;
  }
  return uStack_8;
}

Assistant:

size_t FSE_writeNCount (void* buffer, size_t bufferSize,
                  const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported */
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported */

    if (bufferSize < FSE_NCountWriteBound(maxSymbolValue, tableLog))
        return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 0);

    return FSE_writeNCount_generic(buffer, bufferSize, normalizedCounter, maxSymbolValue, tableLog, 1 /* write in buffer is safe */);
}